

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O2

int GetInstModeSize(int Mode)

{
  int iVar1;
  
  switch(Mode) {
  case 6:
  case 7:
  case 8:
  case 10:
  case 0xb:
    iVar1 = 2;
    break;
  case 9:
    iVar1 = 4;
    break;
  case 0xc:
    return (uint)(Size == 4) * 2 + 2;
  default:
    return 0;
  }
  return iVar1;
}

Assistant:

int GetInstModeSize(int Mode)

/* Determines the size for the various instruction modes. */
{
	switch (Mode) {
	case ARDisp:
	case ARDisX:
	case PCDisp:
	case PCDisX:
	case AbsW:
		return (2);
	case AbsL:
		return (4);
	case MultiM:
		return (0); /* Accounted for by code generator */
	case Imm:
		if (Size == Long)
			return (4);
		else
			return (2);
	default:
		return (0);
	}
}